

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

State * __thiscall re2::DFA::RunStateOnByte(DFA *this,State *state,int c)

{
  uint flag;
  bool bVar1;
  uint uVar2;
  State *pSVar3;
  uint uVar4;
  uint uVar5;
  Workq *pWVar6;
  Workq *pWVar7;
  uint uVar8;
  bool ismatch;
  ostream local_1a8 [376];
  
  if (state < (State *)0x3) {
    if (state == (State *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&ismatch,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x3dc
                );
      std::operator<<(local_1a8,"NULL state in RunStateOnByte");
    }
    else {
      if (state == (State *)0x2) {
        return (State *)0x2;
      }
      if (state == (State *)0x1) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&ismatch,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                   0x3d8);
        std::operator<<(local_1a8,"DeadState in RunStateOnByte");
      }
      else {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&ismatch,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                   0x3df);
        std::operator<<(local_1a8,"Unexpected special state in RunStateOnByte");
      }
    }
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ismatch);
    pSVar3 = (State *)0x0;
  }
  else {
    if (c == 0x100) {
      uVar5 = this->prog_->bytemap_range_;
    }
    else {
      uVar5 = (uint)this->prog_->bytemap_[c];
    }
    pSVar3 = (State *)(&state[1].inst_)[(int)uVar5];
    if (pSVar3 == (State *)0x0) {
      StateToWorkq(this,state,this->q0_);
      uVar5 = state->flag_;
      uVar8 = uVar5 & 0xfff;
      uVar4 = uVar8 | 2;
      if (c != 10) {
        uVar4 = uVar8;
      }
      if (c == 0x100) {
        bVar1 = false;
        uVar4 = uVar4 | 10;
      }
      else {
        bVar1 = Prog::IsWordChar((uint8)c);
      }
      uVar4 = (uint)(byte)((uVar5 >> 0xd & 1) == 0 ^ bVar1) * 0x10 + 0x10 | uVar4;
      pWVar7 = this->q0_;
      pWVar6 = this->q1_;
      if ((uVar5 >> 0x10 & ~uVar8 & uVar4) != 0) {
        RunWorkqOnEmptyString(this,pWVar7,pWVar6,uVar4);
        pWVar6 = this->q0_;
        pWVar7 = this->q1_;
        this->q0_ = pWVar7;
        this->q1_ = pWVar6;
      }
      ismatch = false;
      uVar5 = (uint)(c == 10);
      RunWorkqOnByte(this,pWVar7,pWVar6,c,uVar5,&ismatch,this->kind_);
      pWVar7 = this->q0_;
      if ((c != 0x100) || (pWVar6 = pWVar7, this->kind_ != kManyMatch)) {
        pWVar6 = this->q1_;
        this->q0_ = pWVar6;
        this->q1_ = pWVar7;
      }
      uVar2 = uVar5 + 0x1000;
      if (ismatch == false) {
        uVar2 = uVar5;
      }
      flag = uVar2 + 0x2000;
      if (bVar1 == false) {
        flag = uVar2;
      }
      pSVar3 = WorkqToCachedState(this,pWVar6,flag);
      if (c == 0x100) {
        uVar5 = this->prog_->bytemap_range_;
      }
      else {
        uVar5 = (uint)this->prog_->bytemap_[c];
      }
      (&state[1].inst_)[(int)uVar5] = (int *)pSVar3;
    }
  }
  return pSVar3;
}

Assistant:

DFA::State* DFA::RunStateOnByte(State* state, int c) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();
  if (state <= SpecialStateMax) {
    if (state == FullMatchState) {
      // It is convenient for routines like PossibleMatchRange
      // if we implement RunStateOnByte for FullMatchState:
      // once you get into this state you never get out,
      // so it's pretty easy.
      return FullMatchState;
    }
    if (state == DeadState) {
      LOG(DFATAL) << "DeadState in RunStateOnByte";
      return NULL;
    }
    if (state == NULL) {
      LOG(DFATAL) << "NULL state in RunStateOnByte";
      return NULL;
    }
    LOG(DFATAL) << "Unexpected special state in RunStateOnByte";
    return NULL;
  }

  // If someone else already computed this, return it.
  State* ns = state->next_[ByteMap(c)].load(std::memory_order_relaxed);
  if (ns != NULL)
    return ns;

  // Convert state into Workq.
  StateToWorkq(state, q0_);

  // Flags marking the kinds of empty-width things (^ $ etc)
  // around this byte.  Before the byte we have the flags recorded
  // in the State structure itself.  After the byte we have
  // nothing yet (but that will change: read on).
  uint needflag = state->flag_ >> kFlagNeedShift;
  uint beforeflag = state->flag_ & kFlagEmptyMask;
  uint oldbeforeflag = beforeflag;
  uint afterflag = 0;

  if (c == '\n') {
    // Insert implicit $ and ^ around \n
    beforeflag |= kEmptyEndLine;
    afterflag |= kEmptyBeginLine;
  }

  if (c == kByteEndText) {
    // Insert implicit $ and \z before the fake "end text" byte.
    beforeflag |= kEmptyEndLine | kEmptyEndText;
  }

  // The state flag kFlagLastWord says whether the last
  // byte processed was a word character.  Use that info to
  // insert empty-width (non-)word boundaries.
  bool islastword = (state->flag_ & kFlagLastWord) != 0;
  bool isword = (c != kByteEndText && Prog::IsWordChar(static_cast<uint8>(c)));
  if (isword == islastword)
    beforeflag |= kEmptyNonWordBoundary;
  else
    beforeflag |= kEmptyWordBoundary;

  // Okay, finally ready to run.
  // Only useful to rerun on empty string if there are new, useful flags.
  if (beforeflag & ~oldbeforeflag & needflag) {
    RunWorkqOnEmptyString(q0_, q1_, beforeflag);
    swap(q0_, q1_);
  }
  bool ismatch = false;
  RunWorkqOnByte(q0_, q1_, c, afterflag, &ismatch, kind_);

  // Most of the time, we build the state from the output of
  // RunWorkqOnByte, so swap q0_ and q1_ here.  However, so that
  // RE2::Set can tell exactly which match instructions
  // contributed to the match, don't swap if c is kByteEndText.
  // The resulting state wouldn't be correct for further processing
  // of the string, but we're at the end of the text so that's okay.
  // Leaving q0_ alone preseves the match instructions that led to
  // the current setting of ismatch.
  if (c != kByteEndText || kind_ != Prog::kManyMatch)
    swap(q0_, q1_);

  // Save afterflag along with ismatch and isword in new state.
  uint flag = afterflag;
  if (ismatch)
    flag |= kFlagMatch;
  if (isword)
    flag |= kFlagLastWord;

  ns = WorkqToCachedState(q0_, flag);

  // Flush ns before linking to it.
  // Write barrier before updating state->next_ so that the
  // main search loop can proceed without any locking, for speed.
  // (Otherwise it would need one mutex operation per input byte.)
  state->next_[ByteMap(c)].store(ns, std::memory_order_release);
  return ns;
}